

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QList<QString> * __thiscall
QHash<QString,_QList<QString>_>::value
          (QList<QString> *__return_storage_ptr__,QHash<QString,_QList<QString>_> *this,QString *key
          )

{
  Data *pDVar1;
  Node<QString,_QList<QString>_> *pNVar2;
  QList<QString> *pQVar3;
  
  if (this->d != (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::findNode<QString>
                       (this->d,key);
    if (pNVar2 != (Node<QString,_QList<QString>_> *)0x0) {
      pQVar3 = &pNVar2->value;
      goto LAB_0022b619;
    }
  }
  pQVar3 = (QList<QString> *)0x0;
LAB_0022b619:
  if (pQVar3 == (QList<QString> *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = (pQVar3->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (pQVar3->d).ptr;
    (__return_storage_ptr__->d).size = (pQVar3->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }